

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qringbuffer.cpp
# Opt level: O1

qint64 __thiscall QRingBuffer::indexOf(QRingBuffer *this,char c,qint64 maxLength,qint64 pos)

{
  long lVar1;
  QRingChunk *pQVar2;
  long lVar3;
  bool bVar4;
  long lVar5;
  void *pvVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long local_50;
  
  if ((maxLength != 0) && (lVar1 = (this->buffers).d.size, lVar1 != 0)) {
    pQVar2 = (this->buffers).d.ptr;
    lVar5 = -pos;
    lVar10 = 0;
    do {
      lVar3 = *(long *)((long)&pQVar2->headOffset + lVar10);
      lVar11 = (*(long *)((long)&pQVar2->tailOffset + lVar10) - lVar3) + lVar5;
      lVar9 = lVar11;
      if (maxLength <= lVar11) {
        lVar9 = maxLength;
      }
      if (lVar9 < 1) {
        bVar4 = true;
        lVar5 = lVar9;
      }
      else {
        pcVar7 = *(char **)((long)&(pQVar2->chunk).d.ptr + lVar10);
        if (pcVar7 == (char *)0x0) {
          pcVar7 = "";
        }
        lVar8 = 0;
        if (0 < lVar5) {
          lVar8 = lVar5;
        }
        pvVar6 = memchr(pcVar7 + lVar3 + (lVar5 >> 0x3f & -lVar5),(int)c,lVar9 - lVar8);
        if (pvVar6 == (void *)0x0) {
          bVar4 = lVar11 < maxLength;
          if (maxLength <= lVar11) {
            local_50 = -1;
          }
        }
        else {
          local_50 = (long)pvVar6 +
                     ((pos + lVar8) - (long)(pcVar7 + lVar3 + (lVar5 >> 0x3f & -lVar5)));
          bVar4 = false;
        }
        lVar5 = lVar8;
        if (bVar4) {
          lVar5 = lVar9;
        }
      }
      if (!bVar4) {
        return local_50;
      }
      lVar10 = lVar10 + 0x28;
    } while (lVar1 * 0x28 != lVar10);
  }
  return -1;
}

Assistant:

qint64 QRingBuffer::indexOf(char c, qint64 maxLength, qint64 pos) const
{
    Q_ASSERT(maxLength >= 0 && pos >= 0);

    if (maxLength == 0)
        return -1;

    qint64 index = -pos;
    for (const QRingChunk &chunk : buffers) {
        const qint64 nextBlockIndex = qMin(index + chunk.size(), maxLength);

        if (nextBlockIndex > 0) {
            const char *ptr = chunk.data();
            if (index < 0) {
                ptr -= index;
                index = 0;
            }

            const char *findPtr = reinterpret_cast<const char *>(memchr(ptr, c,
                                                                        nextBlockIndex - index));
            if (findPtr)
                return qint64(findPtr - ptr) + index + pos;

            if (nextBlockIndex == maxLength)
                return -1;
        }
        index = nextBlockIndex;
    }
    return -1;
}